

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::HasValidReferencesOnly
          (CopyPropagateArrays *this,Instruction *ptr_inst,Instruction *store_inst)

{
  Instruction *def;
  bool bVar1;
  IRContext *pIVar2;
  Function *f;
  DefUseManager *this_00;
  anon_class_32_4_bed19430 local_70;
  function<bool_(spvtools::opt::Instruction_*)> local_50;
  DominatorAnalysis *local_30;
  DominatorAnalysis *dominator_analysis;
  BasicBlock *store_block;
  Instruction *store_inst_local;
  Instruction *ptr_inst_local;
  CopyPropagateArrays *this_local;
  
  store_block = (BasicBlock *)store_inst;
  store_inst_local = ptr_inst;
  ptr_inst_local = (Instruction *)this;
  pIVar2 = Pass::context((Pass *)this);
  dominator_analysis =
       (DominatorAnalysis *)IRContext::get_instr_block(pIVar2,(Instruction *)store_block);
  pIVar2 = Pass::context((Pass *)this);
  f = BasicBlock::GetParent((BasicBlock *)dominator_analysis);
  local_30 = IRContext::GetDominatorAnalysis(pIVar2,f);
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  def = store_inst_local;
  local_70.store_inst = (Instruction *)store_block;
  local_70.dominator_analysis = local_30;
  local_70.ptr_inst = store_inst_local;
  local_70.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::CopyPropagateArrays::HasValidReferencesOnly(spvtools::opt::Instruction*,spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_50,&local_70);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,def,&local_50);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_50);
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::HasValidReferencesOnly(Instruction* ptr_inst,
                                                 Instruction* store_inst) {
  BasicBlock* store_block = context()->get_instr_block(store_inst);
  DominatorAnalysis* dominator_analysis =
      context()->GetDominatorAnalysis(store_block->GetParent());

  return get_def_use_mgr()->WhileEachUser(
      ptr_inst,
      [this, store_inst, dominator_analysis, ptr_inst](Instruction* use) {
        if (use->opcode() == spv::Op::OpLoad ||
            use->opcode() == spv::Op::OpImageTexelPointer) {
          // TODO: If there are many load in the same BB as |store_inst| the
          // time to do the multiple traverses can add up.  Consider collecting
          // those loads and doing a single traversal.
          return dominator_analysis->Dominates(store_inst, use);
        } else if (IsInterpolationInstruction(use)) {
          // GLSL InterpolateAt* instructions work similarly to loads
          uint32_t interpolant = use->GetSingleWordInOperand(kInterpolantInIdx);
          if (interpolant !=
              store_inst->GetSingleWordInOperand(kStorePointerInOperand))
            return false;
          return dominator_analysis->Dominates(store_inst, use);
        } else if (use->opcode() == spv::Op::OpAccessChain) {
          return HasValidReferencesOnly(use, store_inst);
        } else if (use->IsDecoration() || use->opcode() == spv::Op::OpName) {
          return true;
        } else if (use->opcode() == spv::Op::OpStore) {
          // If we are storing to part of the object it is not an candidate.
          return ptr_inst->opcode() == spv::Op::OpVariable &&
                 store_inst->GetSingleWordInOperand(kStorePointerInOperand) ==
                     ptr_inst->result_id();
        } else if (IsDebugDeclareOrValue(use)) {
          return true;
        }
        // Some other instruction.  Be conservative.
        return false;
      });
}